

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.cpp
# Opt level: O3

char * u_errorName_63(UErrorCode code)

{
  ulong uVar1;
  char **ppcVar2;
  
  if ((uint)code < 0x1f) {
    uVar1 = (ulong)(uint)code;
    ppcVar2 = _uErrorName;
  }
  else if ((uint)(code + 0x80) < 9) {
    uVar1 = (ulong)(uint)(code + 0x80);
    ppcVar2 = _uErrorInfoName;
  }
  else if ((uint)(code + 0xffff0000) < 0x23) {
    uVar1 = (ulong)(uint)(code + 0xffff0000);
    ppcVar2 = _uTransErrorName;
  }
  else if ((uint)(code + 0xfffeff00) < 0x14) {
    uVar1 = (ulong)(uint)(code + 0xfffeff00);
    ppcVar2 = _uFmtErrorName;
  }
  else if ((uint)(code + 0xfffefe00) < 0xe) {
    uVar1 = (ulong)(uint)(code + 0xfffefe00);
    ppcVar2 = _uBrkErrorName;
  }
  else if ((uint)(code + 0xfffefd00) < 0x16) {
    uVar1 = (ulong)(uint)(code + 0xfffefd00);
    ppcVar2 = _uRegexErrorName;
  }
  else {
    if (8 < (uint)(code + 0xfffefc00)) {
      if ((code & ~U_ILLEGAL_ARGUMENT_ERROR) != U_PLUGIN_ERROR_START) {
        return "[BOGUS UErrorCode]";
      }
      ppcVar2 = _uPluginErrorName + (uint)(code + 0xfffefb00);
      goto LAB_0030a345;
    }
    uVar1 = (ulong)(uint)(code + 0xfffefc00);
    ppcVar2 = _uIDNAErrorName;
  }
  ppcVar2 = ppcVar2 + uVar1;
LAB_0030a345:
  return *ppcVar2;
}

Assistant:

U_CAPI const char * U_EXPORT2
u_errorName(UErrorCode code) {
    if(U_ZERO_ERROR <= code && code < U_STANDARD_ERROR_LIMIT) {
        return _uErrorName[code];
    } else if(U_ERROR_WARNING_START <= code && code < U_ERROR_WARNING_LIMIT) {
        return _uErrorInfoName[code - U_ERROR_WARNING_START];
    } else if(U_PARSE_ERROR_START <= code && code < U_PARSE_ERROR_LIMIT){
        return _uTransErrorName[code - U_PARSE_ERROR_START];
    } else if(U_FMT_PARSE_ERROR_START <= code && code < U_FMT_PARSE_ERROR_LIMIT){
        return _uFmtErrorName[code - U_FMT_PARSE_ERROR_START];
    } else if (U_BRK_ERROR_START <= code  && code < U_BRK_ERROR_LIMIT){
        return _uBrkErrorName[code - U_BRK_ERROR_START];
    } else if (U_REGEX_ERROR_START <= code && code < U_REGEX_ERROR_LIMIT) {
        return _uRegexErrorName[code - U_REGEX_ERROR_START];
    } else if(U_IDNA_ERROR_START <= code && code < U_IDNA_ERROR_LIMIT) {
        return _uIDNAErrorName[code - U_IDNA_ERROR_START];
    } else if(U_PLUGIN_ERROR_START <= code && code < U_PLUGIN_ERROR_LIMIT) {
        return _uPluginErrorName[code - U_PLUGIN_ERROR_START];
    } else {
        return "[BOGUS UErrorCode]";
    }
}